

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

double crnlib::image_utils::compute_ssim(image_u8 *a,image_u8 *b,int channel_index)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  uint in_EDX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  double ssim;
  uint ix;
  uint iy;
  uint x;
  uint y;
  uint total_blocks;
  double total_ssim;
  uint8 sy [36];
  uint8 sx [36];
  uint N;
  uint y_00;
  uint x_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffff60;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  uchar local_78 [40];
  uint8 *in_stack_ffffffffffffffb0;
  uint8 *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc4;
  double local_8;
  
  local_80 = 0.0;
  local_84 = 0;
  local_88 = 0;
  while (x_00 = local_88, uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(in_RDI)
        , x_00 < uVar2) {
    local_8c = 0;
    while (y_00 = local_8c,
          uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(in_RDI), y_00 < uVar2) {
      for (local_90 = 0; local_90 < 6; local_90 = local_90 + 1) {
        for (local_94 = 0; local_94 < 6; local_94 = local_94 + 1) {
          if ((int)in_EDX < 0) {
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (in_stack_ffffffffffffff60,x_00,y_00);
            iVar3 = color_quad<unsigned_char,_int>::get_luma(pcVar4);
            (&stack0xffffffffffffffb8)[local_94 + local_90 * 6] = (char)iVar3;
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (in_stack_ffffffffffffff60,x_00,y_00);
            iVar3 = color_quad<unsigned_char,_int>::get_luma(pcVar4);
            local_78[local_94 + local_90 * 6] = (uchar)iVar3;
          }
          else {
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (in_stack_ffffffffffffff60,x_00,y_00);
            uVar1 = color_quad<unsigned_char,_int>::operator[](pcVar4,in_EDX);
            (&stack0xffffffffffffffb8)[local_94 + local_90 * 6] = uVar1;
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (in_stack_ffffffffffffff60,x_00,y_00);
            uVar1 = color_quad<unsigned_char,_int>::operator[](pcVar4,in_EDX);
            local_78[local_94 + local_90 * 6] = uVar1;
          }
        }
      }
      in_stack_ffffffffffffff60 =
           (image<crnlib::color_quad<unsigned_char,_int>_> *)
           compute_block_ssim(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                              in_stack_ffffffffffffffb0);
      local_80 = (double)in_stack_ffffffffffffff60 + local_80;
      local_84 = local_84 + 1;
      local_8c = local_8c + 6;
    }
    local_88 = local_88 + 6;
  }
  if (local_84 == 0) {
    local_8 = 0.0;
  }
  else {
    local_8 = local_80 / (double)local_84;
  }
  return local_8;
}

Assistant:

double compute_ssim(const image_u8& a, const image_u8& b, int channel_index) {
  const uint N = 6;
  uint8 sx[N * N], sy[N * N];

  double total_ssim = 0.0f;
  uint total_blocks = 0;

  //image_u8 yimg((a.get_width() + N - 1) / N, (a.get_height() + N - 1) / N);

  for (uint y = 0; y < a.get_height(); y += N) {
    for (uint x = 0; x < a.get_width(); x += N) {
      for (uint iy = 0; iy < N; iy++) {
        for (uint ix = 0; ix < N; ix++) {
          if (channel_index < 0)
            sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy).get_luma();
          else
            sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy)[channel_index];

          if (channel_index < 0)
            sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy).get_luma();
          else
            sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy)[channel_index];
        }
      }

      double ssim = compute_block_ssim(N * N, sx, sy);
      total_ssim += ssim;
      total_blocks++;

      //uint ssim_c = (uint)math::clamp<double>(ssim * 127.0f + 128.0f, 0, 255);
      //yimg(x / N, y / N).set(ssim_c, ssim_c, ssim_c, 255);
    }
  }

  if (!total_blocks)
    return 0.0f;

  //save_to_file_stb_or_miniz("ssim.tga", yimg, cWriteFlagGrayscale);

  return total_ssim / total_blocks;
}